

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void __thiscall kratos::Simulator::process_stmt(Simulator *this,AssignStmt *stmt,Var *param_2)

{
  undefined1 local_40 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> val;
  
  eval_expr((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_40,this,
            stmt->right_);
  if (val.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] == '\x01') {
    if (stmt->assign_type_ == NonBlocking) {
      std::
      _Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::Var*&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                ((_Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->nba_values_,&stmt->left_,local_40);
    }
    else {
      set_complex_value_(this,stmt->left_,
                         (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                         local_40);
    }
  }
  if (val.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] == '\x01') {
    val.
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_payload.field2[0x10] = 0;
    if (local_40 != (undefined1  [8])0x0) {
      operator_delete((void *)local_40,
                      (long)val.
                            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_payload._M_value.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_40);
    }
  }
  return;
}

Assistant:

void Simulator::process_stmt(kratos::AssignStmt *stmt, const Var *) {
    auto *right = stmt->right();
    auto val = eval_expr(right);
    if (val) {
        if (stmt->assign_type() != AssignmentType::NonBlocking)
            set_complex_value_(stmt->left(), val);
        else
            nba_values_.emplace(stmt->left(), *val);
    }
}